

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void google::protobuf::compiler::CodeGeneratorResponse_File::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  CodeGeneratorResponse_File *pCVar2;
  string *psVar3;
  CodeGeneratorResponse_File **v1;
  CodeGeneratorResponse_File **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  uint32_t *puVar5;
  Arena *pAVar6;
  GeneratedCodeInfo *pGVar7;
  LogMessage local_d8;
  Voidify local_c1;
  uint local_c0;
  uint32_t cached_has_bits;
  LogMessage local_b0;
  Voidify local_99;
  CodeGeneratorResponse_File *local_98;
  Nullable<const_char_*> local_90;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  CodeGeneratorResponse_File *from;
  CodeGeneratorResponse_File *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_58;
  string *local_50;
  CodeGeneratorResponse_File *local_48;
  anon_union_40_1_493b367e_for_CodeGeneratorResponse_File_3 *local_40;
  string *local_38;
  CodeGeneratorResponse_File *local_30;
  anon_union_40_1_493b367e_for_CodeGeneratorResponse_File_3 *local_28;
  string *local_20;
  CodeGeneratorResponse_File *local_18;
  anon_union_40_1_493b367e_for_CodeGeneratorResponse_File_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (CodeGeneratorResponse_File *)to_msg;
  _this = (CodeGeneratorResponse_File *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)MessageLite::GetArena(to_msg);
  local_98 = (CodeGeneratorResponse_File *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::compiler::CodeGeneratorResponse_File_const*>
                 (&local_98);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::compiler::CodeGeneratorResponse_File*>(&from);
  local_90 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::compiler::CodeGeneratorResponse_File_const*,google::protobuf::compiler::CodeGeneratorResponse_File*>
                       (v1,v2,"&from != _this");
  if (local_90 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_90);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x55a,failure_msg);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_99,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_b0);
  }
  local_c0 = 0;
  puVar5 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).field_0x10,0);
  pCVar2 = from;
  local_c0 = *puVar5;
  if ((local_c0 & 0xf) != 0) {
    if ((local_c0 & 1) != 0) {
      local_50 = _internal_name_abi_cxx11_((CodeGeneratorResponse_File *)arena);
      local_48 = pCVar2;
      local_40 = &pCVar2->field_0;
      puVar5 = internal::HasBits<1>::operator[](&(pCVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_50;
      *puVar5 = *puVar5 | 1;
      pAVar6 = MessageLite::GetArena((MessageLite *)pCVar2);
      internal::ArenaStringPtr::Set<>(&(pCVar2->field_0)._impl_.name_,psVar3,pAVar6);
    }
    pCVar2 = from;
    if ((local_c0 & 2) != 0) {
      local_38 = _internal_insertion_point_abi_cxx11_((CodeGeneratorResponse_File *)arena);
      local_30 = pCVar2;
      local_28 = &pCVar2->field_0;
      puVar5 = internal::HasBits<1>::operator[](&(pCVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_38;
      *puVar5 = *puVar5 | 2;
      pAVar6 = MessageLite::GetArena((MessageLite *)pCVar2);
      internal::ArenaStringPtr::Set<>(&(pCVar2->field_0)._impl_.insertion_point_,psVar3,pAVar6);
    }
    pCVar2 = from;
    if ((local_c0 & 4) != 0) {
      local_20 = _internal_content_abi_cxx11_((CodeGeneratorResponse_File *)arena);
      local_18 = pCVar2;
      local_10 = &pCVar2->field_0;
      puVar5 = internal::HasBits<1>::operator[](&(pCVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_20;
      *puVar5 = *puVar5 | 4;
      pAVar6 = MessageLite::GetArena((MessageLite *)pCVar2);
      internal::ArenaStringPtr::Set<>(&(pCVar2->field_0)._impl_.content_,psVar3,pAVar6);
    }
    if ((local_c0 & 8) != 0) {
      if ((arena->impl_).first_arena_.ptr_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                   ,0x56a,"from._impl_.generated_code_info_ != nullptr");
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_c1,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_d8);
      }
      if ((from->field_0)._impl_.generated_code_info_ == (GeneratedCodeInfo *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.ptr_._M_b._M_p;
        local_58 = absl_log_internal_check_op_result;
        pGVar7 = (GeneratedCodeInfo *)
                 Arena::CopyConstruct<google::protobuf::GeneratedCodeInfo>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.generated_code_info_ = pGVar7;
      }
      else {
        GeneratedCodeInfo::MergeFrom
                  ((from->field_0)._impl_.generated_code_info_,
                   (GeneratedCodeInfo *)(arena->impl_).first_arena_.ptr_._M_b._M_p);
      }
    }
  }
  uVar1 = local_c0;
  puVar5 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar5 = uVar1 | *puVar5;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void CodeGeneratorResponse_File::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<CodeGeneratorResponse_File*>(&to_msg);
  auto& from = static_cast<const CodeGeneratorResponse_File&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_insertion_point(from._internal_insertion_point());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_content(from._internal_content());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.generated_code_info_ != nullptr);
      if (_this->_impl_.generated_code_info_ == nullptr) {
        _this->_impl_.generated_code_info_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.generated_code_info_);
      } else {
        _this->_impl_.generated_code_info_->MergeFrom(*from._impl_.generated_code_info_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}